

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O1

string * __thiscall
re2::FormatKind_abi_cxx11_(string *__return_storage_ptr__,re2 *this,MatchKind kind)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "first match";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "longest match";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "full match";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "many match";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "???";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

static string FormatKind(Prog::MatchKind kind) {
  switch (kind) {
    case Prog::kFullMatch:
      return "full match";
    case Prog::kLongestMatch:
      return "longest match";
    case Prog::kFirstMatch:
      return "first match";
    case Prog::kManyMatch:
      return "many match";
  }
  return "???";
}